

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_secp256k1.cpp
# Opt level: O0

void __thiscall
Secp256k1_RangeProofInfoSecp256k1Test_Test::TestBody
          (Secp256k1_RangeProofInfoSecp256k1Test_Test *this)

{
  bool bVar1;
  char *pcVar2;
  AssertHelper local_f8;
  Message local_f0;
  undefined1 local_e8 [8];
  AssertionResult gtest_ar_3;
  Message local_d0;
  undefined1 local_c8 [8];
  AssertionResult gtest_ar_2;
  Message local_b0;
  undefined1 local_a8 [8];
  AssertionResult gtest_ar_1;
  Message local_90;
  undefined1 local_88 [8];
  AssertionResult gtest_ar;
  Message local_70 [3];
  uint64_t local_58;
  uint64_t max_value;
  uint64_t min_value;
  int mantissa;
  int exponent;
  RangeProofInfoTestVector *test_vector;
  const_iterator __end1;
  const_iterator __begin1;
  vector<RangeProofInfoTestVector,_std::allocator<RangeProofInfoTestVector>_> *__range1;
  Secp256k1 secp;
  secp256k1_context_struct *ctx;
  Secp256k1_RangeProofInfoSecp256k1Test_Test *this_local;
  
  secp.secp256k1_context_ = wally_get_secp_context();
  cfd::core::Secp256k1::Secp256k1((Secp256k1 *)&__range1,secp.secp256k1_context_);
  __end1 = std::vector<RangeProofInfoTestVector,_std::allocator<RangeProofInfoTestVector>_>::begin
                     (&range_proof_info_test_vectors);
  test_vector = (RangeProofInfoTestVector *)
                std::vector<RangeProofInfoTestVector,_std::allocator<RangeProofInfoTestVector>_>::
                end(&range_proof_info_test_vectors);
  while (bVar1 = __gnu_cxx::operator!=
                           (&__end1,(__normal_iterator<const_RangeProofInfoTestVector_*,_std::vector<RangeProofInfoTestVector,_std::allocator<RangeProofInfoTestVector>_>_>
                                     *)&test_vector), bVar1) {
    _mantissa = __gnu_cxx::
                __normal_iterator<const_RangeProofInfoTestVector_*,_std::vector<RangeProofInfoTestVector,_std::allocator<RangeProofInfoTestVector>_>_>
                ::operator*(&__end1);
    bVar1 = testing::internal::AlwaysTrue();
    if (bVar1) {
      bVar1 = testing::internal::AlwaysTrue();
      if (bVar1) {
        cfd::core::Secp256k1::RangeProofInfoSecp256k1
                  ((Secp256k1 *)&__range1,&_mantissa->range_proof,(int *)((long)&min_value + 4),
                   (int *)&min_value,&max_value,&local_58);
      }
    }
    else {
      testing::Message::Message(local_70);
      testing::internal::AssertHelper::AssertHelper
                ((AssertHelper *)&gtest_ar.message_,kNonFatalFailure,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/cryptogarageinc[P]cfd-go/external/cfd-core/test/test_secp256k1.cpp"
                 ,0x1a9,
                 "Expected: secp.RangeProofInfoSecp256k1(test_vector.range_proof, &exponent, &mantissa, &min_value, &max_value) doesn\'t throw an exception.\n  Actual: it throws."
                );
      testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar.message_,local_70);
      testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar.message_);
      testing::Message::~Message(local_70);
    }
    testing::internal::EqHelper<false>::Compare<int,int>
              ((EqHelper<false> *)local_88,"test_vector.expect_exp","exponent",
               &_mantissa->expect_exp,(int *)((long)&min_value + 4));
    bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_88);
    if (!bVar1) {
      testing::Message::Message(&local_90);
      pcVar2 = testing::AssertionResult::failure_message((AssertionResult *)local_88);
      testing::internal::AssertHelper::AssertHelper
                ((AssertHelper *)&gtest_ar_1.message_,kNonFatalFailure,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/cryptogarageinc[P]cfd-go/external/cfd-core/test/test_secp256k1.cpp"
                 ,0x1aa,pcVar2);
      testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_1.message_,&local_90);
      testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_1.message_);
      testing::Message::~Message(&local_90);
    }
    testing::AssertionResult::~AssertionResult((AssertionResult *)local_88);
    testing::internal::EqHelper<false>::Compare<int,int>
              ((EqHelper<false> *)local_a8,"test_vector.expect_mantissa","mantissa",
               &_mantissa->expect_mantissa,(int *)&min_value);
    bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_a8);
    if (!bVar1) {
      testing::Message::Message(&local_b0);
      pcVar2 = testing::AssertionResult::failure_message((AssertionResult *)local_a8);
      testing::internal::AssertHelper::AssertHelper
                ((AssertHelper *)&gtest_ar_2.message_,kNonFatalFailure,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/cryptogarageinc[P]cfd-go/external/cfd-core/test/test_secp256k1.cpp"
                 ,0x1ab,pcVar2);
      testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_2.message_,&local_b0);
      testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_2.message_);
      testing::Message::~Message(&local_b0);
    }
    testing::AssertionResult::~AssertionResult((AssertionResult *)local_a8);
    testing::internal::EqHelper<false>::Compare<unsigned_long,unsigned_long>
              ((EqHelper<false> *)local_c8,"test_vector.expect_minv","min_value",
               &_mantissa->expect_minv,&max_value);
    bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_c8);
    if (!bVar1) {
      testing::Message::Message(&local_d0);
      pcVar2 = testing::AssertionResult::failure_message((AssertionResult *)local_c8);
      testing::internal::AssertHelper::AssertHelper
                ((AssertHelper *)&gtest_ar_3.message_,kNonFatalFailure,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/cryptogarageinc[P]cfd-go/external/cfd-core/test/test_secp256k1.cpp"
                 ,0x1ac,pcVar2);
      testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_3.message_,&local_d0);
      testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_3.message_);
      testing::Message::~Message(&local_d0);
    }
    testing::AssertionResult::~AssertionResult((AssertionResult *)local_c8);
    testing::internal::EqHelper<false>::Compare<unsigned_long,unsigned_long>
              ((EqHelper<false> *)local_e8,"test_vector.expect_maxv","max_value",
               &_mantissa->expect_maxv,&local_58);
    bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_e8);
    if (!bVar1) {
      testing::Message::Message(&local_f0);
      pcVar2 = testing::AssertionResult::failure_message((AssertionResult *)local_e8);
      testing::internal::AssertHelper::AssertHelper
                (&local_f8,kNonFatalFailure,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/cryptogarageinc[P]cfd-go/external/cfd-core/test/test_secp256k1.cpp"
                 ,0x1ad,pcVar2);
      testing::internal::AssertHelper::operator=(&local_f8,&local_f0);
      testing::internal::AssertHelper::~AssertHelper(&local_f8);
      testing::Message::~Message(&local_f0);
    }
    testing::AssertionResult::~AssertionResult((AssertionResult *)local_e8);
    __gnu_cxx::
    __normal_iterator<const_RangeProofInfoTestVector_*,_std::vector<RangeProofInfoTestVector,_std::allocator<RangeProofInfoTestVector>_>_>
    ::operator++(&__end1);
  }
  return;
}

Assistant:

TEST(Secp256k1, RangeProofInfoSecp256k1Test) {
  struct secp256k1_context_struct *ctx = wally_get_secp_context();
  Secp256k1 secp = Secp256k1(ctx);

  for (const RangeProofInfoTestVector& test_vector : range_proof_info_test_vectors) {
    int exponent;
    int mantissa;
    uint64_t min_value;
    uint64_t max_value;
    EXPECT_NO_THROW(secp.RangeProofInfoSecp256k1(test_vector.range_proof, &exponent, &mantissa, &min_value, &max_value));
    EXPECT_EQ(test_vector.expect_exp, exponent);
    EXPECT_EQ(test_vector.expect_mantissa, mantissa);
    EXPECT_EQ(test_vector.expect_minv, min_value);
    EXPECT_EQ(test_vector.expect_maxv, max_value);
  }
}